

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::interface_to_endpoints
          (aux *this,listen_interface_t *iface,listen_socket_flags_t flags,
          span<const_libtorrent::aux::ip_interface> ifs,
          vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
          *eps)

{
  bool bVar1;
  undefined7 in_register_00000011;
  address *this_00;
  byte bVar2;
  long lVar3;
  ip_interface *__begin3;
  transport ssl;
  address adr;
  error_code err;
  bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> local_82;
  aux local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  address local_60;
  error_code local_40;
  
  this_00 = (address *)CONCAT71(in_register_00000011,flags.m_val);
  bVar2 = (char)this[0x25] * '\x02' | (byte)iface;
  local_81 = this[0x24];
  local_40.val_ = 0;
  local_40.failed_ = false;
  local_40.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_82.m_val = bVar2;
  boost::asio::ip::make_address(&local_60,*(char **)this,&local_40);
  if (local_40.failed_ == false) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    ::std::
    vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>::
    emplace_back<boost::asio::ip::address_const&,int_const&,std::__cxx11::string,libtorrent::aux::transport_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::listen_socket_flags_tag,void>&>
              ((vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
                *)ifs.m_len,&local_60,(int *)(this + 0x20),&local_80,(transport *)&local_81,
               &local_82);
    ::std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    local_82.m_val = bVar2 | 4;
    for (lVar3 = (long)ifs.m_ptr * 400; lVar3 != 0; lVar3 = lVar3 + -400) {
      bVar1 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this,(char *)(this_00 + 2));
      if (!bVar1) {
        if (this[0x25] == (aux)0x0) {
          bVar1 = boost::asio::ip::address::is_loopback(this_00);
          if (bVar1) goto LAB_0028dcab;
          bVar1 = is_link_local(this_00);
          bVar2 = bVar1 * '\x02';
        }
        else {
LAB_0028dcab:
          bVar2 = 2;
        }
        local_80._M_dataplus._M_p._0_1_ = bVar2 | local_82.m_val;
        ::std::
        vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
        ::
        emplace_back<boost::asio::ip::address_const&,int_const&,std::__cxx11::string_const&,libtorrent::aux::transport_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::listen_socket_flags_tag,void>>
                  ((vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
                    *)ifs.m_len,this_00,(int *)(this + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (transport *)&local_81,
                   (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> *)
                   &local_80);
      }
      this_00 = (address *)((long)&this_00[0xc].ipv6_address_.addr_.__in6_u + 8);
    }
  }
  return;
}

Assistant:

void interface_to_endpoints(listen_interface_t const& iface
		, listen_socket_flags_t flags
		, span<ip_interface const> const ifs
		, std::vector<listen_endpoint_t>& eps)
	{
		flags |= iface.local ? listen_socket_t::local_network : listen_socket_flags_t{};
		transport const ssl = iface.ssl ? transport::ssl : transport::plaintext;

		// First, check to see if it's an IP address
		error_code err;
		address const adr = make_address(iface.device.c_str(), err);
		if (!err)
		{
			eps.emplace_back(adr, iface.port, std::string{}, ssl, flags);
		}
		else
		{
			flags |= listen_socket_t::was_expanded;

			// this is the case where device names a network device. We need to
			// enumerate all IPs associated with this device
			for (auto const& ipface : ifs)
			{
				// we're looking for a specific interface, and its address
				// (which must be of the same family as the address we're
				// connecting to)
				if (iface.device != ipface.name) continue;

				bool const local = iface.local
					|| ipface.interface_address.is_loopback()
					|| is_link_local(ipface.interface_address);

				eps.emplace_back(ipface.interface_address, iface.port, iface.device
					, ssl, flags | (local ? listen_socket_t::local_network : listen_socket_flags_t{}));
			}
		}
	}